

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_138::GlobalRefining::run(GlobalRefining *this,Module *module)

{
  __node_base_ptr *__dest;
  pointer puVar1;
  _Base_ptr p_Var2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  Expression *pEVar6;
  Module *module_00;
  _Any_data *p_Var7;
  bool bVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  Type TVar11;
  _Rb_tree_node_base *p_Var12;
  size_type sVar13;
  Type left;
  undefined8 uVar14;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  undefined8 *puVar15;
  Function *pFVar16;
  long *plVar17;
  Expression *pEVar18;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar19;
  _Base_ptr p_Var20;
  undefined1 local_348 [8];
  unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
  lubs;
  Index IStack_308;
  undefined1 local_258 [80];
  bool local_208;
  Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_> local_200;
  GlobalRefining *local_128;
  _Any_data *local_120;
  undefined1 local_118 [16];
  code *local_108;
  Module *local_f8;
  ParallelFunctionAnalysis<GlobalInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  unoptimizable;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data *local_40;
  _Rb_tree_node_base *local_38;
  
  if (((module->features).features & 0x400) == 0) {
    return;
  }
  unoptimizable._M_h._M_single_bucket = (__node_base_ptr)0x0;
  analysis._24_8_ = &analysis.field_0x8;
  analysis._8_4_ = 0;
  analysis._16_8_ = 0;
  analysis._40_8_ = 0;
  puVar19 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f8 = module;
  analysis._32_8_ = analysis._24_8_;
  local_40 = (_Any_data *)module;
  if (puVar19 != puVar1) {
    do {
      local_258._0_8_ =
           (puVar19->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::
      map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
      ::operator[]((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                    *)&analysis,(key_type *)local_258);
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar1);
  }
  std::function<void_(wasm::Function_*,_GlobalInfo_&)>::function
            ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)&local_60,
             (function<void_(wasm::Function_*,_GlobalInfo_&)> *)&unoptimizable._M_h._M_single_bucket
            );
  puVar19 = (local_f8->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (local_f8->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 != puVar1) {
    do {
      pFVar16 = (puVar19->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar16->super_Importable).module + 8) != (char *)0x0) {
        local_348 = (undefined1  [8])pFVar16;
        pmVar9 = std::
                 map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                 ::operator[]((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                               *)&analysis,(key_type *)local_348);
        local_258._0_8_ = pFVar16;
        if (local_50 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*local_48)(&local_60,(Function **)local_258,pmVar9);
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar1);
  }
  module_00 = local_f8;
  local_348 = (undefined1  [8])&PTR__PassRunner_010714e0;
  lubs._M_h._M_buckets = (__buckets_ptr)local_f8;
  lubs._M_h._M_bucket_count = (size_type)&local_f8->allocator;
  lubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  lubs._M_h._M_element_count._0_4_ = 0;
  lubs._M_h._M_element_count._4_4_ = 0;
  lubs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
  lubs._M_h._M_rehash_policy._1_7_ = 0;
  lubs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  lubs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0x101;
  lubs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
  lubs._M_h._M_single_bucket._0_4_ = 0;
  lubs._M_h._M_single_bucket._4_4_ = 2;
  IStack_308 = 0xffffffff;
  std::function<void_(wasm::Function_*,_GlobalInfo_&)>::function
            ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)&analysis.field_0x30,
             (function<void_(wasm::Function_*,_GlobalInfo_&)> *)&local_60);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::run(wasm
  ::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::
  function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::
  GlobalInfo&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::(anonymous_namespace)
  ::GlobalRefining::run(wasm::Module*)::GlobalInfo,std::less<wasm::Function*>,std::allocator<std::
  pair<wasm::Function*const,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::
  GlobalInfo>>>&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::
  run(wasm::Module*)::GlobalInfo__>_
            (local_258,module_00,(Map *)&analysis,(Func *)&analysis.field_0x30);
  if ((Function *)local_258._8_8_ != (Function *)local_348 &&
      (Function *)local_258._8_8_ != (Function *)0x0) goto LAB_00875019;
  local_258._8_8_ = (Function *)local_348;
  (**(code **)&(((Importable *)local_258._0_8_)->super_Named).hasExplicitName)(local_258,local_f8);
  local_258._0_8_ = &PTR__Mapper_01072808;
  if (local_108 != (code *)0x0) {
    (*local_108)(local_118,local_118,3);
  }
  if (local_200.stack.flexible.
      super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.stack.flexible.
                    super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_200.stack.flexible.
                          super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.stack.flexible.
                          super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Pass::~Pass((Pass *)local_258);
  if (unoptimizable._M_h._M_bucket_count != 0) {
    (*(code *)unoptimizable._M_h._M_bucket_count)(&analysis.field_0x30,&analysis.field_0x30,3);
  }
  PassRunner::~PassRunner((PassRunner *)local_348);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  __dest = &unoptimizable._M_h._M_single_bucket;
  std::
  _Function_handler<void_(wasm::Function_*,_GlobalInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalRefining.cpp:50:16)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  local_348 = (undefined1  [8])&lubs._M_h._M_rehash_policy._M_next_resize;
  lubs._M_h._M_buckets = (__buckets_ptr)0x1;
  lubs._M_h._M_bucket_count = 0;
  lubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  lubs._M_h._M_element_count._0_4_ = 0x3f800000;
  lubs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
  lubs._M_h._M_rehash_policy._1_7_ = 0;
  lubs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  lubs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0;
  lubs._M_h._M_rehash_policy._M_next_resize._3_1_ = 0;
  lubs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
  if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
    p_Var12 = (_Rb_tree_node_base *)analysis._24_8_;
    do {
      p_Var2 = p_Var12[1]._M_left;
      local_38 = p_Var12;
      for (p_Var20 = p_Var12[1]._M_parent; p_Var20 != p_Var2;
          p_Var20 = (_Base_ptr)&p_Var20->_M_parent) {
        lVar3 = *(long *)p_Var20;
        pmVar10 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_348,(key_type *)(lVar3 + 0x10));
        TVar11 = wasm::Type::getLeastUpperBound
                           ((pmVar10->lub).id,*(uintptr_t *)(*(long *)(lVar3 + 0x20) + 8));
        (pmVar10->lub).id = TVar11.id;
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_38);
    } while (p_Var12 != (_Rb_tree_node_base *)&analysis.field_0x8);
  }
  p_Var7 = local_40;
  analysis._48_8_ = &unoptimizable._M_h._M_rehash_policy._M_next_resize;
  unoptimizable._M_h._M_buckets = (__buckets_ptr)0x1;
  unoptimizable._M_h._M_bucket_count = 0;
  unoptimizable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unoptimizable._M_h._M_element_count._0_4_ = 0x3f800000;
  unoptimizable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  unoptimizable._M_h._M_rehash_policy._4_4_ = 0;
  unoptimizable._M_h._M_rehash_policy._M_next_resize = 0;
  TVar11.id = (uintptr_t)local_40;
  ExportUtils::getExportedGlobals
            ((vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *)local_258,(Module *)local_40
            );
  uVar14 = local_258._8_8_;
  if (local_258._0_8_ != local_258._8_8_) {
    pFVar16 = (Function *)local_258._0_8_;
    do {
      TVar11.id = (pFVar16->super_Importable).super_Named.name.super_IString.str._M_len;
      if (((((this->super_Pass).runner)->options).closedWorld != false) ||
         (*(char *)(TVar11.id + 0x48) == '\x01')) {
        local_60._M_unused._M_object = &analysis.field_0x30;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_60._M_unused._0_8_,TVar11.id,&local_60);
      }
      pFVar16 = (Function *)&(pFVar16->super_Importable).super_Named.name.super_IString.str._M_str;
    } while (pFVar16 != (Function *)uVar14);
  }
  if ((Function *)local_258._0_8_ != (Function *)0x0) {
    TVar11.id = local_258._16_8_ + -local_258._0_8_;
    operator_delete((void *)local_258._0_8_,TVar11.id);
  }
  plVar17 = *(long **)(p_Var7->_M_pod_data + 0x30);
  plVar4 = *(long **)(p_Var7->_M_pod_data + 0x38);
  if (plVar17 != plVar4) {
    uVar14 = 0;
LAB_00874db2:
    local_38 = (_Rb_tree_node_base *)CONCAT44(local_38._4_4_,(int)uVar14);
    do {
      TVar11.id = *plVar17;
      if ((*(long *)(TVar11.id + 0x20) == 0) &&
         (sVar13 = std::
                   _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)&analysis.field_0x30,(key_type *)TVar11.id), sVar13 == 0)) {
        pmVar10 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_348,(key_type *)*plVar17);
        TVar11.id = *(uintptr_t *)(*(long *)(*plVar17 + 0x40) + 8);
        left = wasm::Type::getLeastUpperBound((pmVar10->lub).id,TVar11);
        (pmVar10->lub).id = left.id;
        if ((left.id != 1) && (TVar11.id = *(uintptr_t *)(*plVar17 + 0x38), left.id != TVar11.id))
        goto LAB_00874e1e;
      }
      plVar17 = plVar17 + 1;
      if (plVar17 == plVar4) {
        if (((ulong)local_38 & 1) == 0) break;
        goto LAB_00874e51;
      }
    } while( true );
  }
LAB_00874fde:
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&analysis.field_0x30);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_348);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_GlobalInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_GlobalInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_GlobalInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_GlobalInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
              *)analysis._16_8_,(_Link_type)TVar11.id);
  return;
LAB_00874e1e:
  bVar8 = wasm::Type::isSubType(left,TVar11);
  if (!bVar8) {
    __assert_fail("Type::isSubType(newType, oldType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalRefining.cpp"
                  ,0x6b,"virtual void wasm::(anonymous namespace)::GlobalRefining::run(Module *)");
  }
  lVar3 = *plVar17;
  *(uintptr_t *)(lVar3 + 0x38) = left.id;
  plVar17 = plVar17 + 1;
  uVar14 = CONCAT71((int7)((ulong)lVar3 >> 8),1);
  if (plVar17 == plVar4) goto LAB_00874e51;
  goto LAB_00874db2;
LAB_00874e51:
  p_Var7 = local_40;
  local_258._16_8_ = local_258 + 0x20;
  local_258._24_8_ = (__node_base_ptr)0x0;
  local_258[0x20] = 0;
  local_208 = false;
  local_200.replacep = (Expression **)0x0;
  local_200.stack.usedFixed = 0;
  local_200.stack.flexible.
  super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_200.stack.flexible.
  super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200.stack.flexible.
  super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200.currFunction = (Function *)0x0;
  local_200.currModule = (Module *)0x0;
  local_258._0_8_ = &PTR__WalkerPass_01072868;
  local_120 = local_40;
  local_118[0] = 0;
  local_258._8_8_ = (this->super_Pass).runner;
  TVar11.id = (uintptr_t)local_40;
  local_128 = this;
  WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_> *)
             local_258,(Module *)local_40);
  pFVar16 = (Function *)(this->super_Pass).runner;
  if ((Function *)local_258._8_8_ != pFVar16 && (Function *)local_258._8_8_ != (Function *)0x0) {
LAB_00875019:
    __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                  ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
  }
  local_200.currModule = (Module *)p_Var7;
  puVar5 = *(undefined8 **)(p_Var7->_M_pod_data + 0x38);
  local_258._8_8_ = pFVar16;
  for (puVar15 = *(undefined8 **)(p_Var7->_M_pod_data + 0x30); puVar15 != puVar5;
      puVar15 = puVar15 + 1) {
    TVar11.id = *puVar15;
    if (*(Expression **)(TVar11.id + 0x20) == (Expression *)0x0) {
      TVar11.id = TVar11.id + 0x40;
      Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                (&local_200,(Expression **)TVar11.id);
    }
  }
  p_Var12 = *(_Rb_tree_node_base **)(local_40->_M_pod_data + 0x60);
  local_38 = *(_Rb_tree_node_base **)(local_40->_M_pod_data + 0x68);
  if (p_Var12 != local_38) {
    do {
      TVar11.id = *(uintptr_t *)p_Var12;
      if (*(Expression **)(TVar11.id + 0x28) != (Expression *)0x0) {
        Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                  (&local_200,(Expression **)(TVar11.id + 0x28));
        TVar11.id = *(uintptr_t *)p_Var12;
      }
      pEVar6 = (Expression *)(((key_type *)(TVar11.id + 0x40))->super_IString).str._M_len;
      for (pEVar18 = *(Expression **)(TVar11.id + 0x38); pEVar18 != pEVar6;
          pEVar18 = (Expression *)&pEVar18->type) {
        local_60._M_unused._0_8_ = (undefined8)*(undefined8 *)pEVar18;
        TVar11.id = (uintptr_t)&local_60;
        Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                  (&local_200,(Expression **)&local_60);
      }
      p_Var12 = (_Rb_tree_node_base *)&p_Var12->_M_parent;
    } while (p_Var12 != local_38);
  }
  puVar5 = *(undefined8 **)(local_40->_M_pod_data + 0x98);
  for (puVar15 = *(undefined8 **)(local_40->_M_pod_data + 0x90); puVar15 != puVar5;
      puVar15 = puVar15 + 1) {
    TVar11.id = *puVar15;
    if (*(Expression **)(TVar11.id + 0x30) != (Expression *)0x0) {
      TVar11.id = TVar11.id + 0x30;
      Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                (&local_200,(Expression **)TVar11.id);
    }
  }
  local_200.currModule = (Module *)0x0;
  if (local_200.stack.flexible.
      super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    TVar11.id = (long)local_200.stack.flexible.
                      super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_200.stack.flexible.
                      super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    operator_delete(local_200.stack.flexible.
                    super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,TVar11.id);
  }
  Pass::~Pass((Pass *)local_258);
  goto LAB_00874fde;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // First, find all the global.sets.

    struct GlobalInfo {
      std::vector<GlobalSet*> sets;
    };

    ModuleUtils::ParallelFunctionAnalysis<GlobalInfo> analysis(
      *module, [&](Function* func, GlobalInfo& info) {
        if (func->imported()) {
          return;
        }
        info.sets = std::move(FindAll<GlobalSet>(func->body).list);
      });

    // A map of globals to the lub for that global.
    std::unordered_map<Name, LUBFinder> lubs;

    // Combine all the information we gathered and compute lubs.
    for (auto& [func, info] : analysis.map) {
      for (auto* set : info.sets) {
        lubs[set->name].note(set->value->type);
      }
    }

    // In closed world we cannot change the types of exports, as we might change
    // from a public type to a private that would cause a validation error.
    // TODO We could refine to a type that is still public, however.
    //
    // We are also limited in open world: in that mode we must assume that
    // another module might import our exported globals with the current type
    // (that type is a contract between them), and in such a case the type of
    // mutable globals must match precisely (the same rule as for mutable struct
    // fields in subtypes - the types must match exactly, or else a write in
    // one place could store a type considered in valid in another place).
    std::unordered_set<Name> unoptimizable;
    for (auto* global : ExportUtils::getExportedGlobals(*module)) {
      if (getPassOptions().closedWorld || global->mutable_) {
        unoptimizable.insert(global->name);
      }
    }

    bool optimized = false;

    for (auto& global : module->globals) {
      if (global->imported() || unoptimizable.count(global->name)) {
        continue;
      }

      auto& lub = lubs[global->name];

      // Note the initial value.
      lub.note(global->init->type);

      // The initial value cannot be unreachable, but it might be null, and all
      // other values might be too. In that case, we've noted nothing useful
      // and we can move on.
      if (!lub.noted()) {
        continue;
      }

      auto oldType = global->type;
      auto newType = lub.getLUB();
      if (newType != oldType) {
        // We found an improvement!
        assert(Type::isSubType(newType, oldType));
        global->type = newType;
        optimized = true;
      }
    }

    if (!optimized) {
      return;
    }

    // Update function contents for their new parameter types: global.gets must
    // now return the new type for any globals that we modified.
    struct GetUpdater : public WalkerPass<PostWalker<GetUpdater>> {
      bool isFunctionParallel() override { return true; }

      // Only modifies global.get operations.
      bool requiresNonNullableLocalFixups() override { return false; }

      GlobalRefining& parent;
      Module& wasm;

      GetUpdater(GlobalRefining& parent, Module& wasm)
        : parent(parent), wasm(wasm) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<GetUpdater>(parent, wasm);
      }

      // If we modify anything in a function then we must refinalize so that
      // types propagate outwards.
      bool modified = false;

      void visitGlobalGet(GlobalGet* curr) {
        auto oldType = curr->type;
        auto newType = wasm.getGlobal(curr->name)->type;
        if (newType != oldType) {
          curr->type = newType;
          modified = true;
        }
      }

      void visitFunction(Function* curr) {
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, &wasm);
        }
      }
    } updater(*this, *module);
    updater.run(getPassRunner(), module);
    updater.runOnModuleCode(getPassRunner(), module);
  }